

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButton::keyReleaseEvent(QAbstractButton *this,QKeyEvent *e)

{
  QAbstractButtonPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<Qt::Key> local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  if (-1 < *(short *)(e + 0x50)) {
    QBasicTimer::stop();
  }
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d._0_4_ = 0xaaaaaaaa;
  local_68.d._4_4_ = 0xaaaaaaaa;
  local_68.ptr._0_4_ = 0xaaaaaaaa;
  local_68.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
            (&local_48,QGuiApplicationPrivate::platform_theme,0x28);
  qvariant_cast<QList<Qt::Key>>((QList<Qt::Key> *)&local_68,(QVariant *)&local_48);
  ::QVariant::~QVariant((QVariant *)&local_48);
  local_48._0_4_ = *(undefined4 *)(e + 0x40);
  bVar1 = QListSpecialMethodsBase<Qt::Key>::contains<int>
                    ((QListSpecialMethodsBase<Qt::Key> *)&local_68,(int *)local_48.data);
  if (((bVar1) && (-1 < *(short *)(e + 0x50))) && ((this_00->field_0x28c & 0x10) != 0)) {
    QAbstractButtonPrivate::click(this_00);
  }
  else {
    e[0xc] = (QKeyEvent)0x0;
  }
  QArrayDataPointer<Qt::Key>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QAbstractButton);

    if (!e->isAutoRepeat())
        d->repeatTimer.stop();

    const auto buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                         ->themeHint(QPlatformTheme::ButtonPressKeys)
                                         .value<QList<Qt::Key>>();
    if (buttonPressKeys.contains(e->key()) && !e->isAutoRepeat() && d->down) {
        d->click();
        return;
    }

    e->ignore();
}